

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

task_handle __thiscall
oqpi::scheduler<concurrent_queue>::add(scheduler<concurrent_queue> *this,task_handle *hTask)

{
  bool bVar1;
  task_priority prio;
  task_handle *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  task_handle tVar2;
  task_priority priority;
  task_handle *hTask_local;
  scheduler<concurrent_queue> *this_local;
  
  bVar1 = task_handle::isValid(in_RDX);
  if (((bVar1) && (bVar1 = task_handle::isGrabbed(in_RDX), !bVar1)) &&
     (bVar1 = task_handle::isDone(in_RDX), !bVar1)) {
    prio = resolveTaskPriority((scheduler<concurrent_queue> *)hTask,in_RDX);
    concurrent_queue<oqpi::task_handle>::push
              ((concurrent_queue<oqpi::task_handle> *)
               ((long)hTask + (long)(int)(uint)prio * 0x78 + 0x30),in_RDX);
    wakeUpWorkersWithPriority((scheduler<concurrent_queue> *)hTask,prio);
  }
  task_handle::task_handle((task_handle *)this,in_RDX);
  tVar2.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  tVar2.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (task_handle)tVar2.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

task_handle add(task_handle hTask)
        {
            if (hTask.isValid() && !hTask.isGrabbed() && !hTask.isDone())
            {
                const auto priority = resolveTaskPriority(hTask);
                pendingTasks_[int(priority)].push(hTask);
                wakeUpWorkersWithPriority(priority);
            }
            return hTask;
        }